

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O3

_Bool build_decode_table(u32 *decode_table,u8 *lens,uint num_syms,u32 *decode_results,
                        uint table_bits,uint max_codeword_len,u16 *sorted_syms,uint *table_bits_ret)

{
  u32 uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ushort *puVar19;
  uint local_d4;
  uint len_counts [16];
  uint offsets [16];
  
  uVar7 = (ulong)max_codeword_len;
  memset(len_counts,0,(ulong)max_codeword_len * 4 + 4);
  if (num_syms != 0) {
    uVar6 = 0;
    do {
      len_counts[lens[uVar6]] = len_counts[lens[uVar6]] + 1;
      uVar6 = uVar6 + 1;
    } while (num_syms != uVar6);
  }
  if (1 < max_codeword_len) {
    do {
      max_codeword_len = (uint)uVar7;
      if (len_counts[uVar7] != 0) goto LAB_00104f9d;
      uVar7 = (ulong)(max_codeword_len - 1);
    } while (1 < max_codeword_len - 1);
    max_codeword_len = 1;
  }
LAB_00104f9d:
  if (table_bits_ret != (uint *)0x0) {
    if (max_codeword_len < table_bits) {
      table_bits = max_codeword_len;
    }
    *table_bits_ret = table_bits;
  }
  offsets[0] = 0;
  offsets[1] = len_counts[0];
  if (max_codeword_len < 2) {
    iVar4 = 0;
    uVar7 = 1;
  }
  else {
    uVar7 = (ulong)max_codeword_len;
    lVar15 = 0;
    iVar4 = 0;
    do {
      uVar8 = len_counts[lVar15 + 1];
      len_counts[0] = len_counts[0] + uVar8;
      offsets[lVar15 + 2] = len_counts[0];
      iVar4 = uVar8 + iVar4 * 2;
      lVar15 = lVar15 + 1;
    } while (uVar7 - 1 != lVar15);
    iVar4 = iVar4 * 2;
  }
  uVar8 = iVar4 + len_counts[uVar7];
  if (num_syms != 0) {
    uVar7 = 0;
    do {
      uVar2 = offsets[lens[uVar7]];
      offsets[lens[uVar7]] = uVar2 + 1;
      sorted_syms[uVar2] = (u16)uVar7;
      uVar7 = uVar7 + 1;
    } while (num_syms != uVar7);
  }
  uVar2 = 1 << ((byte)max_codeword_len & 0x1f);
  if (uVar2 < uVar8) {
    _Var10 = false;
  }
  else {
    puVar19 = sorted_syms + offsets[0];
    bVar3 = (byte)table_bits;
    if (uVar2 <= uVar8) {
      uVar7 = 0;
      do {
        uVar2 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar2;
        uVar8 = len_counts[uVar7];
      } while (uVar8 == 0);
      local_d4 = 0;
      if (table_bits < uVar2) {
        uVar11 = 0;
      }
      else {
        uVar2 = 1 << ((byte)uVar2 & 0x1f);
        uVar11 = 0;
        do {
          uVar16 = (uint)uVar7;
          do {
            decode_table[uVar11] = decode_results[*puVar19] + uVar16 * 0x101;
            if (uVar11 == uVar2 - 1) {
              iVar4 = table_bits - uVar16;
              if (table_bits < uVar16 || iVar4 == 0) {
                return true;
              }
              do {
                memcpy(decode_table + uVar2,decode_table,(ulong)uVar2 << 2);
                uVar2 = uVar2 * 2;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
              return true;
            }
            puVar19 = puVar19 + 1;
            uVar12 = uVar2 - 1 ^ uVar11;
            uVar14 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar11 = uVar11 & (1 << ((byte)uVar14 & 0x1f)) - 1U | 1 << (uVar14 & 0x1f);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          do {
            uVar16 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar16;
            if (uVar16 <= table_bits) {
              memcpy(decode_table + uVar2,decode_table,(ulong)uVar2 << 2);
              uVar2 = uVar2 * 2;
            }
            uVar8 = len_counts[uVar16];
          } while (uVar8 == 0);
        } while (uVar16 <= table_bits);
      }
      uVar16 = 1 << (bVar3 & 0x1f);
      uVar2 = uVar16 - 1;
      uVar14 = 0xffffffff;
      do {
        iVar4 = (uint)uVar7 - table_bits;
        uVar18 = 1 << ((byte)iVar4 & 0x1f);
        uVar9 = ~(-1 << ((byte)uVar7 & 0x1f));
        uVar12 = uVar16;
        do {
          uVar13 = uVar11 & uVar2;
          uVar16 = uVar12;
          if (uVar13 != uVar14) {
            iVar5 = iVar4;
            uVar17 = uVar18;
            uVar16 = uVar8;
            uVar14 = (uint)uVar7;
            if (uVar8 < uVar18) {
              do {
                iVar5 = iVar5 + 1;
                uVar17 = 1 << ((byte)iVar5 & 0x1f);
                uVar16 = uVar16 * 2 + len_counts[uVar14 + 1];
                uVar14 = uVar14 + 1;
              } while (uVar16 < uVar17);
            }
            decode_table[uVar13] = uVar12 << 0x10 | table_bits | iVar5 << 8 | 0xc000;
            uVar16 = uVar17 + uVar12;
            local_d4 = uVar12;
            uVar14 = uVar13;
          }
          uVar1 = decode_results[*puVar19];
          uVar12 = (uVar11 >> (bVar3 & 0x1f)) + local_d4;
          do {
            decode_table[uVar12] = uVar1 + iVar4 * 0x101;
            uVar12 = uVar12 + uVar18;
          } while (uVar12 < uVar16);
          if (uVar11 == uVar9) {
            return true;
          }
          uVar13 = uVar11 ^ uVar9;
          uVar12 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          puVar19 = puVar19 + 1;
          uVar11 = uVar11 & (1 << ((byte)uVar12 & 0x1f)) - 1U | 1 << (uVar12 & 0x1f);
          uVar8 = uVar8 - 1;
          uVar12 = uVar16;
        } while (uVar8 != 0);
        do {
          uVar7 = (ulong)((int)uVar7 + 1);
          uVar8 = len_counts[uVar7];
        } while (uVar8 == 0);
      } while( true );
    }
    if (uVar8 == 0) {
      uVar7 = 0;
    }
    else {
      if (uVar8 != 1 << ((byte)max_codeword_len - 1 & 0x1f)) {
        return false;
      }
      if (len_counts[1] != 1) {
        return false;
      }
      uVar7 = (ulong)*puVar19;
    }
    uVar1 = decode_results[uVar7];
    uVar8 = 1;
    do {
      decode_table[uVar8 - 1] = uVar1 + 0x101;
      _Var10 = true;
      uVar2 = uVar8 >> (bVar3 & 0x1f);
      uVar8 = uVar8 + 1;
    } while (uVar2 == 0);
  }
  return _Var10;
}

Assistant:

static bool
build_decode_table(u32 decode_table[],
		   const u8 lens[],
		   const unsigned num_syms,
		   const u32 decode_results[],
		   unsigned table_bits,
		   unsigned max_codeword_len,
		   u16 *sorted_syms,
		   unsigned *table_bits_ret)
{
	unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned offsets[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned sym;		/* current symbol */
	unsigned codeword;	/* current codeword, bit-reversed */
	unsigned len;		/* current codeword length in bits */
	unsigned count;		/* num codewords remaining with this length */
	u32 codespace_used;	/* codespace used out of '2^max_codeword_len' */
	unsigned cur_table_end; /* end index of current table */
	unsigned subtable_prefix; /* codeword prefix of current subtable */
	unsigned subtable_start;  /* start index of current subtable */
	unsigned subtable_bits;   /* log2 of current subtable length */

	/* Count how many codewords have each length, including 0. */
	for (len = 0; len <= max_codeword_len; len++)
		len_counts[len] = 0;
	for (sym = 0; sym < num_syms; sym++)
		len_counts[lens[sym]]++;

	/*
	 * Determine the actual maximum codeword length that was used, and
	 * decrease table_bits to it if allowed.
	 */
	while (max_codeword_len > 1 && len_counts[max_codeword_len] == 0)
		max_codeword_len--;
	if (table_bits_ret != NULL) {
		table_bits = MIN(table_bits, max_codeword_len);
		*table_bits_ret = table_bits;
	}

	/*
	 * Sort the symbols primarily by increasing codeword length and
	 * secondarily by increasing symbol value; or equivalently by their
	 * codewords in lexicographic order, since a canonical code is assumed.
	 *
	 * For efficiency, also compute 'codespace_used' in the same pass over
	 * 'len_counts[]' used to build 'offsets[]' for sorting.
	 */

	/* Ensure that 'codespace_used' cannot overflow. */
	STATIC_ASSERT(sizeof(codespace_used) == 4);
	STATIC_ASSERT(UINT32_MAX / (1U << (DEFLATE_MAX_CODEWORD_LEN - 1)) >=
		      DEFLATE_MAX_NUM_SYMS);

	offsets[0] = 0;
	offsets[1] = len_counts[0];
	codespace_used = 0;
	for (len = 1; len < max_codeword_len; len++) {
		offsets[len + 1] = offsets[len] + len_counts[len];
		codespace_used = (codespace_used << 1) + len_counts[len];
	}
	codespace_used = (codespace_used << 1) + len_counts[len];

	for (sym = 0; sym < num_syms; sym++)
		sorted_syms[offsets[lens[sym]]++] = sym;

	sorted_syms += offsets[0]; /* Skip unused symbols */

	/* lens[] is done being used, so we can write to decode_table[] now. */

	/*
	 * Check whether the lengths form a complete code (exactly fills the
	 * codespace), an incomplete code (doesn't fill the codespace), or an
	 * overfull code (overflows the codespace).  A codeword of length 'n'
	 * uses proportion '1/(2^n)' of the codespace.  An overfull code is
	 * nonsensical, so is considered invalid.  An incomplete code is
	 * considered valid only in two specific cases; see below.
	 */

	/* overfull code? */
	if (unlikely(codespace_used > (1U << max_codeword_len)))
		return false;

	/* incomplete code? */
	if (unlikely(codespace_used < (1U << max_codeword_len))) {
		u32 entry;
		unsigned i;

		/*
		 * The DEFLATE RFC explicitly allows the offset code to be
		 * incomplete in two cases: a code containing just 1 codeword,
		 * if that codeword has length 1; and a code containing no
		 * codewords.  Note: the list of offset codeword lengths is
		 * always nonempty, but lengths of 0 don't count as codewords.
		 *
		 * The RFC doesn't say whether the same cases are allowed for
		 * the litlen and pre codes.  It's actually impossible for no
		 * symbols to be used from these codes; however, it's
		 * technically possible for only one symbol to be used.  zlib
		 * allows 1 codeword for the litlen code, but not the precode.
		 * The RFC also doesn't say whether, when there is 1 codeword,
		 * that codeword is '0' or '1'.  zlib uses '0'.
		 *
		 * We accept what zlib accepts, plus a bit more.  First, we
		 * don't treat the precode more strictly than the litlen and
		 * offset codes.  There's no convincing reason to add a special
		 * case for the precode here.
		 *
		 * Second, we just map each allowed incompete code to a complete
		 * code with only real symbols.  To do this, we choose a symbol,
		 * either the used symbol (for codes with 1 codeword) or an
		 * arbitrary symbol (for empty codes), and give it both
		 * codewords '0' and '1'.  zlib instead uses a special ERROR
		 * symbol in the part of the codespace the code doesn't use.
		 * However, having an ERROR symbol reduces the performance of
		 * the Huffman decoder, for no real benefit.  Our approach also
		 * avoids having to decide whether '0' or '1' is correct.
		 *
		 * Like zlib, we still reject all incomplete codes that contain
		 * more than 1 codeword or a codeword length greater than 1.
		 */
		if (codespace_used == 0) {
			sym = 0; /* arbitrary */
		} else {
			if (codespace_used != (1U << (max_codeword_len - 1)) ||
			    len_counts[1] != 1)
				return false;
			sym = sorted_syms[0];
		}
		entry = make_decode_table_entry(decode_results, sym, 1);
		for (i = 0; i < (1U << table_bits); i++)
			decode_table[i] = entry;
		return true;
	}

	/*
	 * The lengths form a complete code.  Now, enumerate the codewords in
	 * lexicographic order and fill the decode table entries for each one.
	 *
	 * First, process all codewords with len <= table_bits.  Each one gets
	 * '2^(table_bits-len)' direct entries in the table.
	 *
	 * Since DEFLATE uses bit-reversed codewords, these entries aren't
	 * consecutive but rather are spaced '2^len' entries apart.  This makes
	 * filling them naively somewhat awkward and inefficient, since strided
	 * stores are less cache-friendly and preclude the use of word or
	 * vector-at-a-time stores to fill multiple entries per instruction.
	 *
	 * To optimize this, we incrementally double the table size.  When
	 * processing codewords with length 'len', the table is treated as
	 * having only '2^len' entries, so each codeword uses just one entry.
	 * Then, each time 'len' is incremented, the table size is doubled and
	 * the first half is copied to the second half.  This significantly
	 * improves performance over naively doing strided stores.
	 *
	 * Note that some entries copied for each table doubling may not have
	 * been initialized yet, but it doesn't matter since they're guaranteed
	 * to be initialized later (because the Huffman code is complete).
	 */
	codeword = 0;
	len = 1;
	while ((count = len_counts[len]) == 0)
		len++;
	cur_table_end = 1U << len;
	while (len <= table_bits) {
		/* Process all 'count' codewords with length 'len' bits. */
		do {
			unsigned bit;

			/* Fill the first entry for the current codeword. */
			decode_table[codeword] =
				make_decode_table_entry(decode_results,
							*sorted_syms++, len);

			if (codeword == cur_table_end - 1) {
				/* Last codeword (all 1's) */
				for (; len < table_bits; len++) {
					memcpy(&decode_table[cur_table_end],
					       decode_table,
					       cur_table_end *
						sizeof(decode_table[0]));
					cur_table_end <<= 1;
				}
				return true;
			}
			/*
			 * To advance to the lexicographically next codeword in
			 * the canonical code, the codeword must be incremented,
			 * then 0's must be appended to the codeword as needed
			 * to match the next codeword's length.
			 *
			 * Since the codeword is bit-reversed, appending 0's is
			 * a no-op.  However, incrementing it is nontrivial.  To
			 * do so efficiently, use the 'bsr' instruction to find
			 * the last (highest order) 0 bit in the codeword, set
			 * it, and clear any later (higher order) 1 bits.  But
			 * 'bsr' actually finds the highest order 1 bit, so to
			 * use it first flip all bits in the codeword by XOR'ing
			 * it with (1U << len) - 1 == cur_table_end - 1.
			 */
			bit = 1U << bsr32(codeword ^ (cur_table_end - 1));
			codeword &= bit - 1;
			codeword |= bit;
		} while (--count);

		/* Advance to the next codeword length. */
		do {
			if (++len <= table_bits) {
				memcpy(&decode_table[cur_table_end],
				       decode_table,
				       cur_table_end * sizeof(decode_table[0]));
				cur_table_end <<= 1;
			}
		} while ((count = len_counts[len]) == 0);
	}

	/* Process codewords with len > table_bits.  These require subtables. */
	cur_table_end = 1U << table_bits;
	subtable_prefix = -1;
	subtable_start = 0;
	for (;;) {
		u32 entry;
		unsigned i;
		unsigned stride;
		unsigned bit;

		/*
		 * Start a new subtable if the first 'table_bits' bits of the
		 * codeword don't match the prefix of the current subtable.
		 */
		if ((codeword & ((1U << table_bits) - 1)) != subtable_prefix) {
			subtable_prefix = (codeword & ((1U << table_bits) - 1));
			subtable_start = cur_table_end;
			/*
			 * Calculate the subtable length.  If the codeword has
			 * length 'table_bits + n', then the subtable needs
			 * '2^n' entries.  But it may need more; if fewer than
			 * '2^n' codewords of length 'table_bits + n' remain,
			 * then the length will need to be incremented to bring
			 * in longer codewords until the subtable can be
			 * completely filled.  Note that because the Huffman
			 * code is complete, it will always be possible to fill
			 * the subtable eventually.
			 */
			subtable_bits = len - table_bits;
			codespace_used = count;
			while (codespace_used < (1U << subtable_bits)) {
				subtable_bits++;
				codespace_used = (codespace_used << 1) +
					len_counts[table_bits + subtable_bits];
			}
			cur_table_end = subtable_start + (1U << subtable_bits);

			/*
			 * Create the entry that points from the main table to
			 * the subtable.
			 */
			decode_table[subtable_prefix] =
				((u32)subtable_start << 16) |
				HUFFDEC_EXCEPTIONAL |
				HUFFDEC_SUBTABLE_POINTER |
				(subtable_bits << 8) | table_bits;
		}

		/* Fill the subtable entries for the current codeword. */
		entry = make_decode_table_entry(decode_results, *sorted_syms++,
						len - table_bits);
		i = subtable_start + (codeword >> table_bits);
		stride = 1U << (len - table_bits);
		do {
			decode_table[i] = entry;
			i += stride;
		} while (i < cur_table_end);

		/* Advance to the next codeword. */
		if (codeword == (1U << len) - 1) /* last codeword (all 1's)? */
			return true;
		bit = 1U << bsr32(codeword ^ ((1U << len) - 1));
		codeword &= bit - 1;
		codeword |= bit;
		count--;
		while (count == 0)
			count = len_counts[++len];
	}
}